

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall Sampling_InvertUniformSphere_Test::TestBody(Sampling_InvertUniformSphere_Test *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  Point2f up;
  Point2f u;
  AssertionResult gtest_ar;
  Uniform2DIter __begin1;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  float local_a4;
  float local_a0;
  float local_9c;
  AssertHelper local_98;
  long local_90;
  undefined1 local_88 [16];
  Tuple2<pbrt::Point2,_float> local_78;
  Tuple2<pbrt::Point2,_float> local_70;
  internal local_68 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  float local_50;
  float local_4c;
  Uniform2DIter local_48;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  
  local_48.super_RNGIterator<pbrt::detail::Uniform2DIter>.
  super_IndexingIterator<pbrt::detail::Uniform2DIter>.i = 0;
  local_48.super_RNGIterator<pbrt::detail::Uniform2DIter>.
  super_IndexingIterator<pbrt::detail::Uniform2DIter>.n = 1000;
  local_48.super_RNGIterator<pbrt::detail::Uniform2DIter>.rng.inc = 1;
  local_48.super_RNGIterator<pbrt::detail::Uniform2DIter>.rng.state =
       (uint64_t)&DAT_5851f42d4c957f2e;
  do {
    auVar10._0_8_ = pbrt::detail::Uniform2DIter::operator*(&local_48);
    auVar10._8_56_ = extraout_var_00;
    local_70 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar10._0_16_);
    local_4c = local_70.x;
    auVar7 = vfmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)local_70.x),
                             ZEXT416(0xc0000000));
    local_9c = auVar7._0_4_;
    auVar7 = vfnmadd213ss_fma(auVar7,auVar7,SUB6416(ZEXT464(0x3f800000),0));
    auVar7 = vmaxss_avx(auVar7,ZEXT816(0));
    if (auVar7._0_4_ < 0.0) {
      local_a4 = sqrtf(auVar7._0_4_);
    }
    else {
      auVar7 = vsqrtss_avx(auVar7,auVar7);
      local_a4 = auVar7._0_4_;
    }
    local_60._12_4_ = local_70.y;
    local_50 = local_70.y * 6.2831855;
    local_a0 = cosf(local_50);
    local_a0 = local_a0 * local_a4;
    fVar8 = sinf(local_50);
    local_a4 = fVar8 * local_a4;
    auVar11._0_4_ = atan2f(local_a4,local_a0);
    auVar11._4_60_ = extraout_var;
    uVar1 = vcmpss_avx512f(auVar11._0_16_,ZEXT416(0),1);
    bVar4 = (bool)((byte)uVar1 & 1);
    auVar9._0_4_ = (float)((uint)bVar4 * (int)(auVar11._0_4_ + 6.2831855) +
                          (uint)!bVar4 * (int)auVar11._0_4_) / 6.2831855;
    auVar9._4_12_ = extraout_var._0_12_;
    auVar7 = vinsertps_avx(ZEXT416((uint)((1.0 - local_9c) * 0.5)),auVar9,0x10);
    local_78 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar7);
    auVar7._8_4_ = 0x7fffffff;
    auVar7._0_8_ = 0x7fffffff7fffffff;
    auVar7._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx512vl(ZEXT416((uint)(local_4c - local_78.x)),auVar7);
    local_b0.ptr_._0_4_ = auVar7._0_4_;
    local_98.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
    testing::internal::CmpHelperLT<float,double>
              (local_68,"std::abs(u.x - up.x)","1e-3",(float *)&local_b0,(double *)&local_98);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_b0.ptr_ + 0x10),"u ",2);
      pbrt::operator<<((ostream *)(local_b0.ptr_ + 0x10),(Point2<float> *)&local_70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_b0.ptr_ + 0x10)," -> ",4)
      ;
      sVar3.ptr_ = local_b0.ptr_;
      pbrt::internal::ToString3<float>(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,0.0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(sVar3.ptr_ + 0x10),(char *)local_98.data_,local_90);
      if (local_98.data_ != (AssertHelperData *)local_88) {
        operator_delete(local_98.data_,local_88._0_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_b0.ptr_ + 0x10)," -> ",4)
      ;
      pbrt::operator<<((ostream *)(local_b0.ptr_ + 0x10),(Point2<float> *)&local_78);
      pcVar6 = "";
      if ((undefined8 *)local_60._M_allocated_capacity != (undefined8 *)0x0) {
        pcVar6 = *(char **)local_60._M_allocated_capacity;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x5d,pcVar6);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_b0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_b0.ptr_ + 8))();
        }
        local_b0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_allocated_capacity,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    auVar2._8_4_ = 0x7fffffff;
    auVar2._0_8_ = 0x7fffffff7fffffff;
    auVar2._12_4_ = 0x7fffffff;
    auVar7 = vandps_avx512vl(ZEXT416((uint)((float)local_60._12_4_ - local_78.y)),auVar2);
    local_b0.ptr_._0_4_ = auVar7._0_4_;
    local_98.data_ = (AssertHelperData *)&DAT_3f50624dd2f1a9fc;
    testing::internal::CmpHelperLT<float,double>
              (local_68,"std::abs(u.y - up.y)","1e-3",(float *)&local_b0,(double *)&local_98);
    if (local_68[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_b0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_b0.ptr_ + 0x10),"u ",2);
      pbrt::operator<<((ostream *)(local_b0.ptr_ + 0x10),(Point2<float> *)&local_70);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_b0.ptr_ + 0x10)," -> ",4)
      ;
      sVar3.ptr_ = local_b0.ptr_;
      pbrt::internal::ToString3<float>(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48,0.0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(sVar3.ptr_ + 0x10),(char *)local_98.data_,local_90);
      if (local_98.data_ != (AssertHelperData *)local_88) {
        operator_delete(local_98.data_,local_88._0_8_ + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_b0.ptr_ + 0x10)," -> ",4)
      ;
      pbrt::operator<<((ostream *)(local_b0.ptr_ + 0x10),(Point2<float> *)&local_78);
      pcVar6 = "";
      if ((undefined8 *)local_60._M_allocated_capacity != (undefined8 *)0x0) {
        pcVar6 = *(char **)local_60._M_allocated_capacity;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_98,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                 ,0x5e,pcVar6);
      testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_98);
      if (local_b0.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar4 = testing::internal::IsTrue(true);
        if ((bVar4) &&
           (local_b0.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_b0.ptr_ + 8))();
        }
        local_b0.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_allocated_capacity,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar5 = local_48.super_RNGIterator<pbrt::detail::Uniform2DIter>.
            super_IndexingIterator<pbrt::detail::Uniform2DIter>.i + 1;
    local_48.super_RNGIterator<pbrt::detail::Uniform2DIter>.
    super_IndexingIterator<pbrt::detail::Uniform2DIter>.i = iVar5;
  } while (iVar5 != 1000);
  return;
}

Assistant:

TEST(Sampling, InvertUniformSphere) {
    for (Point2f u : Uniform2D(1000)) {
        Vector3f v = SampleUniformSphere(u);
        Point2f up = InvertUniformSphereSample(v);

        EXPECT_LT(std::abs(u.x - up.x), 1e-3) << "u " << u << " -> " << v << " -> " << up;
        EXPECT_LT(std::abs(u.y - up.y), 1e-3) << "u " << u << " -> " << v << " -> " << up;
    }
}